

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O3

void Gia_ManIncrSimUpdate(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  uint uVar3;
  int *piVar4;
  word *pwVar5;
  word wVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  size_t __size;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  
  pVVar7 = p->vTimeStamps;
  uVar3 = pVVar7->nSize;
  iVar10 = p->nObjs;
  if (iVar10 < (int)uVar3) {
    __assert_fail("Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x46f,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if ((int)uVar3 < iVar10) {
    iVar1 = pVVar7->nCap;
    iVar9 = iVar1 * 2;
    if (iVar9 < iVar10) {
      if (iVar1 < iVar10) {
        if (pVVar7->pArray == (int *)0x0) {
          piVar4 = (int *)malloc((long)iVar10 << 2);
        }
        else {
          piVar4 = (int *)realloc(pVVar7->pArray,(long)iVar10 << 2);
        }
        pVVar7->pArray = piVar4;
        iVar9 = iVar10;
LAB_00227ed9:
        if (piVar4 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar7->nCap = iVar9;
        uVar3 = pVVar7->nSize;
      }
    }
    else if (iVar1 < iVar10) {
      if (pVVar7->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar4 = (int *)realloc(pVVar7->pArray,(long)iVar1 << 3);
      }
      pVVar7->pArray = piVar4;
      goto LAB_00227ed9;
    }
    if ((int)uVar3 < iVar10) {
      memset(pVVar7->pArray + (int)uVar3,0,(ulong)(~uVar3 + iVar10) * 4 + 4);
    }
    pVVar7->nSize = iVar10;
    iVar10 = p->nObjs;
  }
  pVVar2 = p->vSims;
  uVar3 = pVVar2->nSize;
  lVar11 = (long)iVar10 * (long)p->nSimWords;
  iVar10 = (int)lVar11;
  if (iVar10 < (int)uVar3) {
    __assert_fail("Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x472,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if (iVar10 <= (int)uVar3) goto LAB_00227fd5;
  iVar1 = pVVar2->nCap;
  iVar9 = iVar1 * 2;
  if (iVar9 < iVar10) {
    if (iVar1 < iVar10) {
      __size = lVar11 * 8;
      if (pVVar2->pArray == (word *)0x0) {
        pwVar5 = (word *)malloc(__size);
      }
      else {
        pwVar5 = (word *)realloc(pVVar2->pArray,__size);
      }
      pVVar2->pArray = pwVar5;
      iVar9 = iVar10;
LAB_00227f9d:
      if (pwVar5 == (word *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
      }
      pVVar2->nCap = iVar9;
      uVar3 = pVVar2->nSize;
    }
  }
  else if (iVar1 < iVar10) {
    if (pVVar2->pArray == (word *)0x0) {
      pwVar5 = (word *)malloc((long)iVar1 << 4);
    }
    else {
      pwVar5 = (word *)realloc(pVVar2->pArray,(long)iVar1 << 4);
    }
    pVVar2->pArray = pwVar5;
    goto LAB_00227f9d;
  }
  if ((int)uVar3 < iVar10) {
    memset(pVVar2->pArray + (int)uVar3,0,(ulong)(~uVar3 + iVar10) * 8 + 8);
  }
  pVVar2->nSize = iVar10;
LAB_00227fd5:
  uVar3 = p->iNextPi;
  uVar12 = (ulong)uVar3;
  pVVar7 = p->vCis;
  iVar10 = pVVar7->nSize;
  if (iVar10 < (int)uVar3) {
    __assert_fail("p->iNextPi <= Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSim.c"
                  ,0x475,"void Gia_ManIncrSimUpdate(Gia_Man_t *)");
  }
  if ((int)uVar3 < iVar10) {
    do {
      if ((int)uVar3 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pVVar7->pArray[uVar12];
      if ((iVar10 < 0) || (p->nObjs <= iVar10)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar8 = iVar10 * p->nSimWords;
      if (((int)uVar8 < 0) || (p->vSims->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (0 < p->nSimWords) {
        pwVar5 = p->vSims->pArray;
        lVar11 = 0;
        do {
          wVar6 = Gia_ManRandomW(0);
          pwVar5[(ulong)uVar8 + lVar11] = wVar6;
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->nSimWords);
        pVVar7 = p->vCis;
      }
      uVar12 = uVar12 + 1;
      iVar10 = pVVar7->nSize;
    } while ((int)uVar12 < iVar10);
  }
  p->iNextPi = iVar10;
  return;
}

Assistant:

void Gia_ManIncrSimUpdate( Gia_Man_t * p )
{
    int i, k;
    // extend timestamp info
    assert( Vec_IntSize(p->vTimeStamps) <= Gia_ManObjNum(p) );
    Vec_IntFillExtra( p->vTimeStamps, Gia_ManObjNum(p), 0 );
    // extend simulation info
    assert( Vec_WrdSize(p->vSims) <= Gia_ManObjNum(p) * p->nSimWords );
    Vec_WrdFillExtra( p->vSims,  Gia_ManObjNum(p) * p->nSimWords,  0 );
    // extend PI info
    assert( p->iNextPi <= Gia_ManCiNum(p) );
    for ( i = p->iNextPi; i < Gia_ManCiNum(p); i++ )
    {
        word * pSims = Gia_ManBuiltInData( p, Gia_ManCiIdToId(p, i) );
        for ( k = 0; k < p->nSimWords; k++ )
            pSims[k] = Gia_ManRandomW(0);
    }
    p->iNextPi = Gia_ManCiNum(p);
}